

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_alt.cc
# Opt level: O3

GENERAL_NAMES *
v2i_GENERAL_NAMES(X509V3_EXT_METHOD *method,X509V3_CTX *ctx,stack_st_CONF_VALUE *nval)

{
  OPENSSL_STACK *sk;
  size_t sVar1;
  CONF_VALUE *cnf;
  GENERAL_NAME *a;
  X509V3_EXT_METHOD *pXVar2;
  X509V3_EXT_METHOD *i;
  
  sk = OPENSSL_sk_new_null();
  if (sk == (OPENSSL_STACK *)0x0) {
LAB_0022384e:
    sk = (OPENSSL_STACK *)0x0;
  }
  else {
    sVar1 = OPENSSL_sk_num((OPENSSL_STACK *)nval);
    if (sVar1 != 0) {
      i = (X509V3_EXT_METHOD *)0x0;
      do {
        pXVar2 = i;
        cnf = (CONF_VALUE *)OPENSSL_sk_value((OPENSSL_STACK *)nval,(size_t)i);
        a = v2i_GENERAL_NAME_ex((GENERAL_NAME *)0x0,pXVar2,ctx,cnf,0);
        if ((a == (GENERAL_NAME *)0x0) || (sVar1 = OPENSSL_sk_push(sk,a), sVar1 == 0)) {
          GENERAL_NAME_free(a);
          OPENSSL_sk_pop_free_ex(sk,sk_GENERAL_NAME_call_free_func,GENERAL_NAME_free);
          goto LAB_0022384e;
        }
        i = (X509V3_EXT_METHOD *)((long)&i->ext_nid + 1);
        pXVar2 = (X509V3_EXT_METHOD *)OPENSSL_sk_num((OPENSSL_STACK *)nval);
      } while (i < pXVar2);
    }
  }
  return (GENERAL_NAMES *)sk;
}

Assistant:

GENERAL_NAMES *v2i_GENERAL_NAMES(const X509V3_EXT_METHOD *method,
                                 const X509V3_CTX *ctx,
                                 const STACK_OF(CONF_VALUE) *nval) {
  GENERAL_NAMES *gens = sk_GENERAL_NAME_new_null();
  if (gens == NULL) {
    return NULL;
  }
  for (size_t i = 0; i < sk_CONF_VALUE_num(nval); i++) {
    const CONF_VALUE *cnf = sk_CONF_VALUE_value(nval, i);
    GENERAL_NAME *gen = v2i_GENERAL_NAME(method, ctx, cnf);
    if (gen == NULL || !sk_GENERAL_NAME_push(gens, gen)) {
      GENERAL_NAME_free(gen);
      goto err;
    }
  }
  return gens;
err:
  sk_GENERAL_NAME_pop_free(gens, GENERAL_NAME_free);
  return NULL;
}